

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

Result __thiscall wabt::interp::Table::Set(Table *this,Store *store,u32 offset,Ref ref)

{
  bool bVar1;
  reference pvVar2;
  u32 offset_local;
  Store *store_local;
  Table *this_local;
  Ref ref_local;
  
  bVar1 = IsValidRange(this,offset,1);
  if ((bVar1) &&
     (bVar1 = Store::HasValueType(store,ref,
                                  (ValueType)*(Enum *)&(this->type_).super_ExternType.field_0xc),
     bVar1)) {
    pvVar2 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                       (&this->elements_,(ulong)offset);
    pvVar2->index = ref.index;
    Result::Result((Result *)((long)&ref_local.index + 4),Ok);
  }
  else {
    Result::Result((Result *)((long)&ref_local.index + 4),Error);
  }
  return (Result)ref_local.index._4_4_;
}

Assistant:

Result Table::Set(Store& store, u32 offset, Ref ref) {
  if (IsValidRange(offset, 1) && store.HasValueType(ref, type_.element)) {
    elements_[offset] = ref;
    return Result::Ok;
  }
  return Result::Error;
}